

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles31::Functional::createSeparateShaderTests(Context *ctx)

{
  TestParams params_00;
  TestParams params_01;
  TestParams params_02;
  undefined4 uVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 this;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  deUint32 dVar12;
  TestCaseGroup *this_00;
  TestCaseGroup *pTVar13;
  SeparateShaderTest *pSVar14;
  TestContext *pTVar15;
  CommandLine *this_01;
  TestCaseGroup *pTVar16;
  RenderContext *pRVar17;
  ContextInfo *pCVar18;
  size_type sVar19;
  const_reference ppTVar20;
  TestParams *params_03;
  undefined8 in_R9;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar21;
  int local_c2c;
  undefined1 local_c28 [4];
  int i_2;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children_1;
  ShaderLibrary shaderLibrary_1;
  TestCaseGroup *es32Group;
  undefined1 local_be8 [4];
  int i_1;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  ShaderLibrary shaderLibrary;
  TestCaseGroup *es31Group;
  TestCaseGroup *interfaceMismatchGroup;
  allocator<char> local_b89;
  string local_b88;
  allocator<char> local_b61;
  string local_b60;
  undefined1 local_b39;
  code *local_b38;
  undefined8 uStack_b30;
  allocator<char> local_b21;
  string local_b20;
  allocator<char> local_af9;
  string local_af8;
  undefined1 local_ad1;
  code *local_ad0;
  undefined8 uStack_ac8;
  allocator<char> local_ab9;
  string local_ab8;
  allocator<char> local_a91;
  string local_a90;
  undefined1 local_a69;
  code *local_a68;
  undefined8 uStack_a60;
  allocator<char> local_a51;
  string local_a50;
  allocator<char> local_a29;
  string local_a28;
  undefined1 local_a08 [8];
  TestParams params_5;
  TestCaseGroup *apiGroup;
  undefined1 local_9c8 [8];
  string name_2;
  string local_998;
  TestParams local_978;
  int local_95c;
  undefined1 local_958 [4];
  deUint32 genIterations;
  string code;
  TestParams params_4;
  deUint32 i;
  TestCaseGroup *randomGroup;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seen;
  Random rnd;
  deUint32 baseSeed;
  string local_8b8;
  string local_898;
  allocator<char> local_871;
  string local_870;
  allocator<char> local_849;
  string local_848;
  ostringstream local_828 [8];
  ostringstream desc_1;
  ostringstream local_6b0 [8];
  ostringstream name_1;
  undefined1 local_538 [8];
  TestParams params_3;
  BindingKind binding;
  VaryingInterpolation vtxInterp;
  VaryingInterpolation frgInterp;
  deUint32 tmpFlags;
  deUint32 flags_3;
  TestCaseGroup *interfaceGroup;
  allocator<char> local_4d9;
  string local_4d8;
  allocator<char> local_4b1;
  undefined1 local_4b0 [40];
  TestParams params_2;
  deUint32 flags_2;
  TestCaseGroup *createShaderProgramGroup;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  undefined1 local_420 [40];
  TestParams params_1;
  deUint32 flags_1;
  TestCaseGroup *programUniformGroup;
  string local_3b0;
  undefined1 local_390 [48];
  ostringstream desc;
  ostringstream local_1f0 [8];
  ostringstream name;
  undefined8 uStack_78;
  TestParams params;
  ParamFlags local_54;
  deUint32 flags;
  TestCaseGroup *stagesGroup;
  TestCaseGroup *group;
  int numIterations;
  TestParams defaultParams;
  Context *ctx_local;
  
  defaultParams.varyings._12_8_ = ctx;
  anon_unknown_0::TestParams::TestParams((TestParams *)((long)&group + 4));
  group._0_4_ = 4;
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(Context *)defaultParams.varyings._12_8_,"separate_shader",
             "Separate shader tests");
  group._7_1_ = 0;
  group._4_1_ = 0;
  group._5_1_ = 0;
  group._6_1_ = 0;
  numIterations._1_1_ = 0;
  numIterations._2_1_ = 0;
  numIterations._0_1_ = 0;
  defaultParams.initSingle = false;
  defaultParams.switchVtx = false;
  defaultParams.switchFrg = false;
  defaultParams.useUniform = false;
  defaultParams.useSameName = false;
  defaultParams.useCreateHelper = false;
  defaultParams.useProgramUniform = false;
  defaultParams._7_1_ = 0;
  defaultParams.varyings.count = 0;
  defaultParams.varyings.type = TYPE_FLOAT_MAT2;
  defaultParams.varyings.binding = 5;
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(Context *)defaultParams.varyings._12_8_,"pipeline",
             "Pipeline configuration tests");
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar13);
  for (local_54 = 0; iVar11 = defaultParams.varyings.count, uVar6 = defaultParams._4_4_,
      uVar5 = defaultParams._0_4_, local_54 < 0x20; local_54 = local_54 + PARAMFLAGS_SWITCH_FRAGMENT
      ) {
    uVar1 = CONCAT13(group._7_1_,CONCAT12(group._6_1_,CONCAT11(group._5_1_,group._4_1_)));
    uStack_78 = CONCAT17(numIterations._3_1_,
                         CONCAT16(numIterations._2_1_,
                                  CONCAT15(numIterations._1_1_,
                                           CONCAT14((undefined1)numIterations,uVar1))));
    params_00.varyings.frgInterp = defaultParams.varyings.binding;
    params_00.varyings.vtxInterp = defaultParams.varyings.type;
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_390 + 0x28));
    bVar8 = anon_unknown_0::areCaseParamFlagsValid(local_54 & PARAMFLAGS_MASK);
    if (bVar8) {
      if ((local_54 & 0x10) == 0) {
        std::operator<<((ostream *)local_1f0,"different_");
        std::operator<<((ostream *)(local_390 + 0x28),"Differently named ");
      }
      else {
        uVar2 = (ulong)uStack_78 >> 0x28;
        uStack_78._5_3_ = (undefined3)uVar2;
        uStack_78._0_5_ = CONCAT14(1,uVar1);
        std::operator<<((ostream *)local_1f0,"same_");
        std::operator<<((ostream *)(local_390 + 0x28),"Identically named ");
      }
      if ((local_54 & PARAMFLAGS_LAST) == 0) {
        std::operator<<((ostream *)local_1f0,"constant_");
        std::operator<<((ostream *)(local_390 + 0x28),"constants, ");
      }
      else {
        uStack_78._0_4_ = CONCAT13(1,(undefined3)uStack_78);
        std::operator<<((ostream *)local_1f0,"uniform_");
        std::operator<<((ostream *)(local_390 + 0x28),"uniforms, ");
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::ostringstream::str();
      uVar7 = defaultParams._4_4_;
      uVar1 = defaultParams._0_4_;
      defaultParams.initSingle = SUB41(uVar5,0);
      defaultParams.switchVtx = SUB41(uVar5,1);
      defaultParams.switchFrg = SUB41(uVar5,2);
      defaultParams.useUniform = SUB41(uVar5,3);
      params_00.varyings.count._0_1_ = defaultParams.initSingle;
      params_00.varyings.count._1_1_ = defaultParams.switchVtx;
      params_00.varyings.count._2_1_ = defaultParams.switchFrg;
      params_00.varyings.count._3_1_ = defaultParams.useUniform;
      params_00.initSingle = (bool)(undefined1)uStack_78;
      params_00.switchVtx = (bool)uStack_78._1_1_;
      params_00.switchFrg = (bool)uStack_78._2_1_;
      params_00.useUniform = (bool)uStack_78._3_1_;
      params_00.useSameName = (bool)uStack_78._4_1_;
      params_00.useCreateHelper = (bool)uStack_78._5_1_;
      params_00.useProgramUniform = (bool)uStack_78._6_1_;
      params_00._7_1_ = uStack_78._7_1_;
      defaultParams.useSameName = SUB41(uVar6,0);
      defaultParams.useCreateHelper = SUB41(uVar6,1);
      defaultParams.useProgramUniform = SUB41(uVar6,2);
      defaultParams._7_1_ = SUB41(uVar6,3);
      params_00.varyings.type._0_1_ = defaultParams.useSameName;
      params_00.varyings.type._1_1_ = defaultParams.useCreateHelper;
      params_00.varyings.type._2_1_ = defaultParams.useProgramUniform;
      params_00.varyings.type._3_1_ = defaultParams._7_1_;
      params_00.varyings.binding = iVar11;
      defaultParams._0_4_ = uVar1;
      defaultParams._4_4_ = uVar7;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)pTVar13,(TestCaseGroup *)local_390,&local_3b0,
                 (string *)(ulong)(uint)group,local_54 & PARAMFLAGS_MASK,(ParamFlags)in_R9,params_00
                );
      std::__cxx11::string::~string((string *)&local_3b0);
      std::__cxx11::string::~string((string *)local_390);
      local_390._36_4_ = 0;
    }
    else {
      local_390._36_4_ = 4;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_390 + 0x28));
    std::__cxx11::ostringstream::~ostringstream(local_1f0);
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(Context *)defaultParams.varyings._12_8_,"program_uniform",
             "ProgramUniform tests");
  unique0x10002155 = pTVar13;
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar13);
  for (params_1.varyings.vtxInterp = VARYINGINTERPOLATION_SMOOTH; params_1.varyings.vtxInterp < 8;
      params_1.varyings.vtxInterp = params_1.varyings.vtxInterp + VARYINGINTERPOLATION_FLAT) {
    local_420._32_8_ =
         CONCAT17(numIterations._3_1_,
                  CONCAT16(numIterations._2_1_,
                           CONCAT15(numIterations._1_1_,
                                    CONCAT14((undefined1)numIterations,
                                             CONCAT13(group._7_1_,
                                                      CONCAT12(group._6_1_,
                                                               CONCAT11(group._5_1_,group._4_1_)))))
                          ));
    params_1.initSingle = defaultParams.initSingle;
    params_1.switchVtx = defaultParams.switchVtx;
    params_1.switchFrg = defaultParams.switchFrg;
    params_1.useUniform = defaultParams.useUniform;
    params_1.useSameName = defaultParams.useSameName;
    params_1.useCreateHelper = defaultParams.useCreateHelper;
    params_1.useProgramUniform = defaultParams.useProgramUniform;
    params_1._7_1_ = defaultParams._7_1_;
    params_1.varyings.count = defaultParams.varyings.count;
    params_1.varyings.type = defaultParams.varyings.type;
    params_1.varyings.binding = defaultParams.varyings.binding;
    bVar8 = anon_unknown_0::areCaseParamFlagsValid(params_1.varyings.vtxInterp);
    this = stack0xfffffffffffffc20;
    uVar3 = local_420._32_8_;
    if (bVar8) {
      local_420[0x23] = 1;
      uVar4 = local_420._32_8_;
      local_420[0x27] = SUB81(uVar3,7);
      local_420._32_6_ = (undefined6)uVar4;
      local_420[0x26] = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_420,"",&local_421);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"",&local_449);
      params_01.varyings.frgInterp = params_1.varyings.binding;
      params_01.varyings.vtxInterp = params_1.varyings.type;
      params_01.varyings.count._0_1_ = params_1.initSingle;
      params_01.varyings.count._1_1_ = params_1.switchVtx;
      params_01.varyings.count._2_1_ = params_1.switchFrg;
      params_01.varyings.count._3_1_ = params_1.useUniform;
      params_01.initSingle = (bool)local_420[0x20];
      params_01.switchVtx = (bool)local_420[0x21];
      params_01.switchFrg = (bool)local_420[0x22];
      params_01.useUniform = (bool)local_420[0x23];
      params_01.useSameName = (bool)local_420[0x24];
      params_01.useCreateHelper = (bool)local_420[0x25];
      params_01.useProgramUniform = (bool)local_420[0x26];
      params_01._7_1_ = local_420[0x27];
      params_01.varyings.type._0_1_ = params_1.useSameName;
      params_01.varyings.type._1_1_ = params_1.useCreateHelper;
      params_01.varyings.type._2_1_ = params_1.useProgramUniform;
      params_01.varyings.type._3_1_ = params_1._7_1_;
      params_01.varyings.binding = params_1.varyings.count;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)this,(TestCaseGroup *)local_420,&local_448,
                 (string *)(ulong)(uint)group,params_1.varyings.vtxInterp,(ParamFlags)in_R9,
                 params_01);
      std::__cxx11::string::~string((string *)&local_448);
      std::allocator<char>::~allocator(&local_449);
      std::__cxx11::string::~string((string *)local_420);
      std::allocator<char>::~allocator(&local_421);
    }
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(Context *)defaultParams.varyings._12_8_,"create_shader_program",
             "CreateShaderProgram tests");
  unique0x1000214d = pTVar13;
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar13);
  for (params_2.varyings.vtxInterp = VARYINGINTERPOLATION_SMOOTH; params_2.varyings.vtxInterp < 8;
      params_2.varyings.vtxInterp = params_2.varyings.vtxInterp + VARYINGINTERPOLATION_FLAT) {
    local_4b0._32_8_ =
         CONCAT17(numIterations._3_1_,
                  CONCAT16(numIterations._2_1_,
                           CONCAT15(numIterations._1_1_,
                                    CONCAT14((undefined1)numIterations,
                                             CONCAT13(group._7_1_,
                                                      CONCAT12(group._6_1_,
                                                               CONCAT11(group._5_1_,group._4_1_)))))
                          ));
    params_2.initSingle = defaultParams.initSingle;
    params_2.switchVtx = defaultParams.switchVtx;
    params_2.switchFrg = defaultParams.switchFrg;
    params_2.useUniform = defaultParams.useUniform;
    params_2.useSameName = defaultParams.useSameName;
    params_2.useCreateHelper = defaultParams.useCreateHelper;
    params_2.useProgramUniform = defaultParams.useProgramUniform;
    params_2._7_1_ = defaultParams._7_1_;
    params_2.varyings.count = defaultParams.varyings.count;
    params_2.varyings.type = defaultParams.varyings.type;
    params_2.varyings.binding = defaultParams.varyings.binding;
    bVar8 = anon_unknown_0::areCaseParamFlagsValid(params_2.varyings.vtxInterp);
    uVar3 = stack0xfffffffffffffb90;
    if (bVar8) {
      local_4b0[0x25] = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_4b0,"",&local_4b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d8,"",&local_4d9);
      params_02.varyings.frgInterp = params_2.varyings.binding;
      params_02.varyings.vtxInterp = params_2.varyings.type;
      params_02.varyings.count._0_1_ = params_2.initSingle;
      params_02.varyings.count._1_1_ = params_2.switchVtx;
      params_02.varyings.count._2_1_ = params_2.switchFrg;
      params_02.varyings.count._3_1_ = params_2.useUniform;
      params_02.initSingle = (bool)local_4b0[0x20];
      params_02.switchVtx = (bool)local_4b0[0x21];
      params_02.switchFrg = (bool)local_4b0[0x22];
      params_02.useUniform = (bool)local_4b0[0x23];
      params_02.useSameName = (bool)local_4b0[0x24];
      params_02.useCreateHelper = (bool)local_4b0[0x25];
      params_02.useProgramUniform = (bool)local_4b0[0x26];
      params_02._7_1_ = local_4b0[0x27];
      params_02.varyings.type._0_1_ = params_2.useSameName;
      params_02.varyings.type._1_1_ = params_2.useCreateHelper;
      params_02.varyings.type._2_1_ = params_2.useProgramUniform;
      params_02.varyings.type._3_1_ = params_2._7_1_;
      params_02.varyings.binding = params_2.varyings.count;
      anon_unknown_0::addRenderTest
                ((anon_unknown_0 *)uVar3,(TestCaseGroup *)local_4b0,&local_4d8,
                 (string *)(ulong)(uint)group,params_2.varyings.vtxInterp,(ParamFlags)in_R9,
                 params_02);
      std::__cxx11::string::~string((string *)&local_4d8);
      std::allocator<char>::~allocator(&local_4d9);
      std::__cxx11::string::~string((string *)local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
    }
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(Context *)defaultParams.varyings._12_8_,"interface",
             "Shader interface compatibility tests");
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar13);
  for (frgInterp = VARYINGINTERPOLATION_SMOOTH; frgInterp < 0x20;
      frgInterp = frgInterp + VARYINGINTERPOLATION_FLAT) {
    uVar10 = frgInterp >> 4 & 1;
    local_538[1] = (bool)group._5_1_;
    local_538[0] = (bool)group._4_1_;
    local_538[2] = (bool)group._6_1_;
    local_538[3] = (bool)group._7_1_;
    local_538[4] = (bool)(undefined1)numIterations;
    local_538[5] = (bool)numIterations._1_1_;
    local_538[6] = (bool)numIterations._2_1_;
    local_538[7] = numIterations._3_1_;
    params_3.varyings.binding = defaultParams.varyings.binding;
    params_3.varyings.type = defaultParams.varyings.type;
    params_3.varyings.count = defaultParams.varyings.count;
    params_3.initSingle = defaultParams.initSingle;
    params_3.switchVtx = defaultParams.switchVtx;
    params_3.switchFrg = defaultParams.switchFrg;
    params_3.useUniform = defaultParams.useUniform;
    params_3.useSameName = defaultParams.useSameName;
    params_3.useCreateHelper = defaultParams.useCreateHelper;
    params_3.useProgramUniform = defaultParams.useProgramUniform;
    params_3._7_1_ = defaultParams._7_1_;
    std::__cxx11::ostringstream::ostringstream(local_6b0);
    std::__cxx11::ostringstream::ostringstream(local_828);
    params_3.initSingle = true;
    params_3.switchVtx = false;
    params_3.switchFrg = false;
    params_3.useUniform = false;
    params_3.useSameName = true;
    params_3.useCreateHelper = false;
    params_3.useProgramUniform = false;
    params_3._7_1_ = 0;
    params_3.varyings._4_8_ = CONCAT44(frgInterp,frgInterp >> 2) & 0x300000003;
    params_3.varyings.count = uVar10;
    if (uVar10 == 0) {
      std::operator<<((ostream *)local_6b0,"same_name");
      std::operator<<((ostream *)local_828,"Varyings have same name, ");
    }
    else if (uVar10 == 1) {
      std::operator<<((ostream *)local_6b0,"same_location");
      std::operator<<((ostream *)local_828,"Varyings have same location, ");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_848,"vertex",&local_849);
    anon_unknown_0::describeInterpolation
              (&local_848,frgInterp >> 2 & VARYINGINTERPOLATION_DEFAULT,(ostringstream *)local_6b0,
               (ostringstream *)local_828);
    std::__cxx11::string::~string((string *)&local_848);
    std::allocator<char>::~allocator(&local_849);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"fragment",&local_871);
    anon_unknown_0::describeInterpolation
              (&local_870,frgInterp & VARYINGINTERPOLATION_DEFAULT,(ostringstream *)local_6b0,
               (ostringstream *)local_828);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator(&local_871);
    bVar8 = anon_unknown_0::paramsValid((TestParams *)local_538);
    if (bVar8) {
      pSVar14 = (SeparateShaderTest *)operator_new(0x180);
      uVar3 = defaultParams.varyings._12_8_;
      std::__cxx11::ostringstream::str();
      std::__cxx11::ostringstream::str();
      anon_unknown_0::SeparateShaderTest::SeparateShaderTest
                (pSVar14,(Context *)uVar3,&local_898,&local_8b8,(uint)group,(TestParams *)local_538,
                 0x715d00);
      tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pSVar14);
      std::__cxx11::string::~string((string *)&local_8b8);
      std::__cxx11::string::~string((string *)&local_898);
      local_390._36_4_ = 0;
    }
    else {
      local_390._36_4_ = 0xd;
    }
    std::__cxx11::ostringstream::~ostringstream(local_828);
    std::__cxx11::ostringstream::~ostringstream(local_6b0);
  }
  pTVar15 = Context::getTestContext((Context *)defaultParams.varyings._12_8_);
  this_01 = tcu::TestContext::getCommandLine(pTVar15);
  iVar11 = tcu::CommandLine::getBaseSeed(this_01);
  dVar12 = deStringHash("separate_shader.random");
  de::Random::Random((Random *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     dVar12 + iVar11);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&randomGroup);
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(Context *)defaultParams.varyings._12_8_,"random",
             "Random pipeline configuration tests");
  unique0x10002131 = pTVar13;
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar13);
  for (params_4.varyings.vtxInterp = VARYINGINTERPOLATION_SMOOTH; params_4.varyings.vtxInterp < 0x80
      ; params_4.varyings.vtxInterp = params_4.varyings.vtxInterp + VARYINGINTERPOLATION_FLAT) {
    anon_unknown_0::TestParams::TestParams((TestParams *)((long)&code.field_2 + 8));
    std::__cxx11::string::string((string *)local_958);
    local_95c = 0x1000;
    do {
      dVar12 = de::Random::getUint32
                         ((Random *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
      anon_unknown_0::genParams(&local_978,dVar12);
      params_4.varyings.type = local_978.varyings.vtxInterp;
      params_4.varyings.binding = local_978.varyings.frgInterp;
      code.field_2._8_1_ = local_978.initSingle;
      code.field_2._9_1_ = local_978.switchVtx;
      code.field_2._10_1_ = local_978.switchFrg;
      code.field_2._11_1_ = local_978.useUniform;
      code.field_2._12_1_ = local_978.useSameName;
      code.field_2._13_1_ = local_978.useCreateHelper;
      code.field_2._14_1_ = local_978.useProgramUniform;
      code.field_2._15_1_ = local_978._7_1_;
      (anonymous_namespace)::paramsCode_abi_cxx11_
                (&local_998,(_anonymous_namespace_ *)(code.field_2._M_local_buf + 8),params_03);
      std::__cxx11::string::operator=((string *)local_958,(string *)&local_998);
      std::__cxx11::string::~string((string *)&local_998);
      bVar9 = de::
              contains<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                        ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&randomGroup,(key_type *)local_958);
      bVar8 = false;
      if (bVar9) {
        local_95c = local_95c + -1;
        bVar8 = local_95c != 0;
      }
    } while (bVar8);
    pVar21 = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&randomGroup,(value_type *)local_958);
    name_2.field_2._8_8_ = pVar21.first._M_node;
    de::toString<unsigned_int>((string *)local_9c8,&params_4.varyings.vtxInterp);
    pTVar13 = stack0xfffffffffffff6e8;
    pSVar14 = (SeparateShaderTest *)operator_new(0x180);
    anon_unknown_0::SeparateShaderTest::SeparateShaderTest
              (pSVar14,(Context *)defaultParams.varyings._12_8_,(string *)local_9c8,
               (string *)local_9c8,(uint)group,(TestParams *)((long)&code.field_2 + 8),0x715d00);
    tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)local_9c8);
    std::__cxx11::string::~string((string *)local_958);
  }
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(Context *)defaultParams.varyings._12_8_,"api","Program pipeline API tests");
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar13);
  local_a08[1] = group._5_1_;
  local_a08[0] = group._4_1_;
  local_a08[2] = group._6_1_;
  local_a08[5] = numIterations._1_1_;
  local_a08[4] = (undefined1)numIterations;
  local_a08[6] = numIterations._2_1_;
  local_a08[7] = numIterations._3_1_;
  params_5.varyings.binding = defaultParams.varyings.binding;
  params_5.varyings.type = defaultParams.varyings.type;
  params_5.varyings.count = defaultParams.varyings.count;
  params_5.initSingle = defaultParams.initSingle;
  params_5.switchVtx = defaultParams.switchVtx;
  params_5.switchFrg = defaultParams.switchFrg;
  params_5.useUniform = defaultParams.useUniform;
  params_5.useSameName = defaultParams.useSameName;
  params_5.useCreateHelper = defaultParams.useCreateHelper;
  params_5.useProgramUniform = defaultParams.useProgramUniform;
  params_5._7_1_ = defaultParams._7_1_;
  local_a08[3] = true;
  pSVar14 = (SeparateShaderTest *)operator_new(0x180);
  uVar3 = defaultParams.varyings._12_8_;
  local_a69 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a28,"current_program_priority",&local_a29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a50,"Test priority between current program and pipeline binding",
             &local_a51);
  local_a68 = anon_unknown_0::SeparateShaderTest::testCurrentProgPriority;
  uStack_a60 = 0;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar14,(Context *)uVar3,&local_a28,&local_a50,1,(TestParams *)local_a08,0x716c20);
  local_a69 = 0;
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pSVar14);
  std::__cxx11::string::~string((string *)&local_a50);
  std::allocator<char>::~allocator(&local_a51);
  std::__cxx11::string::~string((string *)&local_a28);
  std::allocator<char>::~allocator(&local_a29);
  pSVar14 = (SeparateShaderTest *)operator_new(0x180);
  uVar3 = defaultParams.varyings._12_8_;
  local_ad1 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a90,"active_program_uniform",&local_a91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ab8,"Test that glUniform() affects a pipeline\'s active program",
             &local_ab9);
  local_ad0 = anon_unknown_0::SeparateShaderTest::testActiveProgramUniform;
  uStack_ac8 = 0;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar14,(Context *)uVar3,&local_a90,&local_ab8,1,(TestParams *)local_a08,0x717440);
  local_ad1 = 0;
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pSVar14);
  std::__cxx11::string::~string((string *)&local_ab8);
  std::allocator<char>::~allocator(&local_ab9);
  std::__cxx11::string::~string((string *)&local_a90);
  std::allocator<char>::~allocator(&local_a91);
  pSVar14 = (SeparateShaderTest *)operator_new(0x180);
  uVar3 = defaultParams.varyings._12_8_;
  local_b39 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_af8,"pipeline_programs",&local_af9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b20,"Test queries for programs in program pipeline stages",&local_b21)
  ;
  local_b38 = anon_unknown_0::SeparateShaderTest::testPipelineQueryPrograms;
  uStack_b30 = 0;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar14,(Context *)uVar3,&local_af8,&local_b20,1,(TestParams *)local_a08,0x717d30);
  local_b39 = 0;
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pSVar14);
  std::__cxx11::string::~string((string *)&local_b20);
  std::allocator<char>::~allocator(&local_b21);
  std::__cxx11::string::~string((string *)&local_af8);
  std::allocator<char>::~allocator(&local_af9);
  pSVar14 = (SeparateShaderTest *)operator_new(0x180);
  uVar3 = defaultParams.varyings._12_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b60,"pipeline_active",&local_b61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b88,"Test query for active programs in a program pipeline",&local_b89)
  ;
  anon_unknown_0::SeparateShaderTest::SeparateShaderTest
            (pSVar14,(Context *)uVar3,&local_b60,&local_b88,1,(TestParams *)local_a08,0x7180e0);
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pSVar14);
  std::__cxx11::string::~string((string *)&local_b88);
  std::allocator<char>::~allocator(&local_b89);
  std::__cxx11::string::~string((string *)&local_b60);
  std::allocator<char>::~allocator(&local_b61);
  pTVar13 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar13,(Context *)defaultParams.varyings._12_8_,"validation",
             "Negative program pipeline interface matching");
  tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pTVar13);
  pTVar16 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar16,(Context *)defaultParams.varyings._12_8_,"es31",
             "GLSL ES 3.1 pipeline interface matching");
  pTVar15 = Context::getTestContext((Context *)defaultParams.varyings._12_8_);
  pRVar17 = Context::getRenderContext((Context *)defaultParams.varyings._12_8_);
  pCVar18 = Context::getContextInfo((Context *)defaultParams.varyings._12_8_);
  gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,pTVar15,pRVar17,pCVar18);
  gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_be8,
             (ShaderLibrary *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage,
             "shaders/es31/separate_shader_validation.test");
  for (es32Group._4_4_ = 0;
      sVar19 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_be8),
      es32Group._4_4_ < (int)sVar19; es32Group._4_4_ = es32Group._4_4_ + 1) {
    ppTVar20 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_be8,
                          (long)es32Group._4_4_);
    tcu::TestNode::addChild((TestNode *)pTVar16,*ppTVar20);
  }
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pTVar16);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_be8);
  gls::ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &children.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage);
  pTVar16 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar16,(Context *)defaultParams.varyings._12_8_,"es32",
             "GLSL ES 3.2 pipeline interface matching");
  pTVar15 = Context::getTestContext((Context *)defaultParams.varyings._12_8_);
  pRVar17 = Context::getRenderContext((Context *)defaultParams.varyings._12_8_);
  pCVar18 = Context::getContextInfo((Context *)defaultParams.varyings._12_8_);
  gls::ShaderLibrary::ShaderLibrary
            ((ShaderLibrary *)
             &children_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,pTVar15,pRVar17,pCVar18);
  gls::ShaderLibrary::loadShaderFile
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_c28,
             (ShaderLibrary *)
             &children_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             "shaders/es32/separate_shader_validation.test");
  for (local_c2c = 0;
      sVar19 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::size
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_c28),
      local_c2c < (int)sVar19; local_c2c = local_c2c + 1) {
    ppTVar20 = std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::operator[]
                         ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_c28,
                          (long)local_c2c);
    tcu::TestNode::addChild((TestNode *)pTVar16,*ppTVar20);
  }
  tcu::TestNode::addChild((TestNode *)pTVar13,(TestNode *)pTVar16);
  std::vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>::~vector
            ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)local_c28);
  gls::ShaderLibrary::~ShaderLibrary
            ((ShaderLibrary *)
             &children_1.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_390._36_4_ = 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&randomGroup);
  de::Random::~Random((Random *)&seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return this_00;
}

Assistant:

TestCaseGroup* createSeparateShaderTests (Context& ctx)
{
	TestParams		defaultParams;
	int				numIterations	= 4;
	TestCaseGroup*	group			=
		new TestCaseGroup(ctx, "separate_shader", "Separate shader tests");

	defaultParams.useUniform			= false;
	defaultParams.initSingle			= false;
	defaultParams.switchVtx				= false;
	defaultParams.switchFrg				= false;
	defaultParams.useCreateHelper		= false;
	defaultParams.useProgramUniform		= false;
	defaultParams.useSameName			= false;
	defaultParams.varyings.count		= 0;
	defaultParams.varyings.type			= glu::TYPE_INVALID;
	defaultParams.varyings.binding		= BINDING_NAME;
	defaultParams.varyings.vtxInterp	= VARYINGINTERPOLATION_LAST;
	defaultParams.varyings.frgInterp	= VARYINGINTERPOLATION_LAST;

	TestCaseGroup* stagesGroup =
		new TestCaseGroup(ctx, "pipeline", "Pipeline configuration tests");
	group->addChild(stagesGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST << 2; ++flags)
	{
		TestParams		params			= defaultParams;
		ostringstream	name;
		ostringstream	desc;

		if (!areCaseParamFlagsValid(ParamFlags(flags & PARAMFLAGS_MASK)))
			continue;

		if (flags & (PARAMFLAGS_LAST << 1))
		{
			params.useSameName = true;
			name << "same_";
			desc << "Identically named ";
		}
		else
		{
			name << "different_";
			desc << "Differently named ";
		}

		if (flags & PARAMFLAGS_LAST)
		{
			params.useUniform = true;
			name << "uniform_";
			desc << "uniforms, ";
		}
		else
		{
			name << "constant_";
			desc << "constants, ";
		}

		addRenderTest(*stagesGroup, name.str(), desc.str(), numIterations,
					  ParamFlags(flags & PARAMFLAGS_MASK), params);
	}

	TestCaseGroup* programUniformGroup =
		new TestCaseGroup(ctx, "program_uniform", "ProgramUniform tests");
	group->addChild(programUniformGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useUniform = true;
		params.useProgramUniform = true;

		addRenderTest(*programUniformGroup, "", "", numIterations, ParamFlags(flags), params);
	}

	TestCaseGroup* createShaderProgramGroup =
		new TestCaseGroup(ctx, "create_shader_program", "CreateShaderProgram tests");
	group->addChild(createShaderProgramGroup);

	for (deUint32 flags = 0; flags < PARAMFLAGS_LAST; ++flags)
	{
		TestParams		params			= defaultParams;

		if (!areCaseParamFlagsValid(ParamFlags(flags)))
			continue;

		params.useCreateHelper = true;

		addRenderTest(*createShaderProgramGroup, "", "", numIterations,
					  ParamFlags(flags), params);
	}

	TestCaseGroup* interfaceGroup =
		new TestCaseGroup(ctx, "interface", "Shader interface compatibility tests");
	group->addChild(interfaceGroup);

	enum
	{
		NUM_INTERPOLATIONS	= VARYINGINTERPOLATION_RANDOM, // VARYINGINTERPOLATION_RANDOM is one after last fully specified interpolation
		INTERFACEFLAGS_LAST = BINDING_LAST * NUM_INTERPOLATIONS * NUM_INTERPOLATIONS
	};

	for (deUint32 flags = 0; flags < INTERFACEFLAGS_LAST; ++flags)
	{
		deUint32				tmpFlags	= flags;
		VaryingInterpolation	frgInterp	= VaryingInterpolation(tmpFlags % NUM_INTERPOLATIONS);
		VaryingInterpolation	vtxInterp	= VaryingInterpolation((tmpFlags /= NUM_INTERPOLATIONS)
																   % NUM_INTERPOLATIONS);
		BindingKind				binding		= BindingKind((tmpFlags /= NUM_INTERPOLATIONS)
														  % BINDING_LAST);
		TestParams				params		= defaultParams;
		ostringstream			name;
		ostringstream			desc;

		params.varyings.count		= 1;
		params.varyings.type		= glu::TYPE_FLOAT;
		params.varyings.binding		= binding;
		params.varyings.vtxInterp	= vtxInterp;
		params.varyings.frgInterp	= frgInterp;

		switch (binding)
		{
			case BINDING_LOCATION:
				name << "same_location";
				desc << "Varyings have same location, ";
				break;
			case BINDING_NAME:
				name << "same_name";
				desc << "Varyings have same name, ";
				break;
			default:
				DE_FATAL("Impossible");
		}

		describeInterpolation("vertex", vtxInterp, name, desc);
		describeInterpolation("fragment", frgInterp, name, desc);

		if (!paramsValid(params))
			continue;

		interfaceGroup->addChild(
			new SeparateShaderTest(ctx, name.str(), desc.str(), numIterations, params,
								   &SeparateShaderTest::testPipelineRendering));
	}

	deUint32		baseSeed	= ctx.getTestContext().getCommandLine().getBaseSeed();
	Random			rnd			(deStringHash("separate_shader.random") + baseSeed);
	set<string>		seen;
	TestCaseGroup*	randomGroup	= new TestCaseGroup(
		ctx, "random", "Random pipeline configuration tests");
	group->addChild(randomGroup);

	for (deUint32 i = 0; i < 128; ++i)
	{
		TestParams		params;
		string			code;
		deUint32		genIterations	= 4096;

		do
		{
			params	= genParams(rnd.getUint32());
			code	= paramsCode(params);
		} while (de::contains(seen, code) && --genIterations > 0);

		seen.insert(code);

		string name = de::toString(i); // Would be code but baseSeed can change

		randomGroup->addChild(new SeparateShaderTest(
								  ctx, name, name, numIterations, params,
								  &SeparateShaderTest::testPipelineRendering));
	}

	TestCaseGroup* apiGroup =
		new TestCaseGroup(ctx, "api", "Program pipeline API tests");
	group->addChild(apiGroup);

	{
		// More or less random parameters. These shouldn't have much effect, so just
		// do a single sample.
		TestParams params = defaultParams;
		params.useUniform = true;
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "current_program_priority",
								  "Test priority between current program and pipeline binding",
								  1, params, &SeparateShaderTest::testCurrentProgPriority));
		apiGroup->addChild(new SeparateShaderTest(
								  ctx,
								  "active_program_uniform",
								  "Test that glUniform() affects a pipeline's active program",
								  1, params, &SeparateShaderTest::testActiveProgramUniform));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_programs",
								 "Test queries for programs in program pipeline stages",
								 1, params, &SeparateShaderTest::testPipelineQueryPrograms));

		apiGroup->addChild(new SeparateShaderTest(
								 ctx,
								 "pipeline_active",
								 "Test query for active programs in a program pipeline",
								 1, params, &SeparateShaderTest::testPipelineQueryActive));
	}

	TestCaseGroup* interfaceMismatchGroup =
		new TestCaseGroup(ctx, "validation", "Negative program pipeline interface matching");
	group->addChild(interfaceMismatchGroup);

	{
		TestCaseGroup*						es31Group		= new TestCaseGroup(ctx, "es31", "GLSL ES 3.1 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es31/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es31Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es31Group);
	}

	{
		TestCaseGroup*						es32Group		= new TestCaseGroup(ctx, "es32", "GLSL ES 3.2 pipeline interface matching");
		gls::ShaderLibrary					shaderLibrary	(ctx.getTestContext(), ctx.getRenderContext(), ctx.getContextInfo());
		const std::vector<tcu::TestNode*>	children		= shaderLibrary.loadShaderFile("shaders/es32/separate_shader_validation.test");

		for (int i = 0; i < (int)children.size(); i++)
			es32Group->addChild(children[i]);

		interfaceMismatchGroup->addChild(es32Group);
	}

	return group;
}